

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

Tas_Man_t * Tas_ManAlloc(Gia_Man_t *pAig,int nBTLimit)

{
  int iVar1;
  Tas_Man_t *pPars;
  Gia_Obj_t **ppGVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  int *piVar5;
  float *pfVar6;
  Tas_Man_t *p;
  int nBTLimit_local;
  Gia_Man_t *pAig_local;
  
  pPars = (Tas_Man_t *)calloc(1,0x120);
  Tas_SetDefaultParams((Tas_Par_t *)pPars);
  pPars->pAig = pAig;
  (pPars->Pars).nBTLimit = nBTLimit;
  (pPars->pClauses).nSize = 10000;
  (pPars->pJust).nSize = 10000;
  (pPars->pProp).nSize = 10000;
  ppGVar2 = (Gia_Obj_t **)malloc((long)(pPars->pProp).nSize << 3);
  (pPars->pProp).pData = ppGVar2;
  ppGVar2 = (Gia_Obj_t **)malloc((long)(pPars->pJust).nSize << 3);
  (pPars->pJust).pData = ppGVar2;
  ppGVar2 = (Gia_Obj_t **)malloc((long)(pPars->pClauses).nSize << 3);
  (pPars->pClauses).pData = ppGVar2;
  (pPars->pClauses).iTail = 1;
  (pPars->pClauses).iHead = 1;
  pVVar3 = Vec_IntAlloc(1000);
  pPars->vModel = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pPars->vLevReas = pVVar3;
  pVVar4 = Vec_PtrAlloc(1000);
  pPars->vTemp = pVVar4;
  (pPars->pStore).iCur = 0x10;
  (pPars->pStore).nSize = 10000;
  piVar5 = (int *)malloc((long)(pPars->pStore).nSize << 2);
  (pPars->pStore).pData = piVar5;
  iVar1 = Gia_ManObjNum(pAig);
  piVar5 = (int *)calloc((long)(iVar1 << 1),4);
  pPars->pWatches = piVar5;
  pVVar3 = Vec_IntAlloc(100);
  pPars->vWatchLits = pVVar3;
  iVar1 = Gia_ManObjNum(pAig);
  pfVar6 = (float *)calloc((long)iVar1,4);
  pPars->pActivity = pfVar6;
  pVVar3 = Vec_IntAlloc(100);
  pPars->vActiveVars = pVVar3;
  return pPars;
}

Assistant:

Tas_Man_t * Tas_ManAlloc( Gia_Man_t * pAig, int nBTLimit )
{
    Tas_Man_t * p;
    p = ABC_CALLOC( Tas_Man_t, 1 );
    Tas_SetDefaultParams( &p->Pars );
    p->pAig           = pAig;
    p->Pars.nBTLimit  = nBTLimit;
    p->pProp.nSize    = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData    = ABC_ALLOC( Gia_Obj_t *, p->pProp.nSize );
    p->pJust.pData    = ABC_ALLOC( Gia_Obj_t *, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( Gia_Obj_t *, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel         = Vec_IntAlloc( 1000 );
    p->vLevReas       = Vec_IntAlloc( 1000 );
    p->vTemp          = Vec_PtrAlloc( 1000 );
    p->pStore.iCur    = 16;
    p->pStore.nSize   = 10000;
    p->pStore.pData   = ABC_ALLOC( int, p->pStore.nSize );
    p->pWatches       = ABC_CALLOC( int, 2 * Gia_ManObjNum(pAig) );
    p->vWatchLits     = Vec_IntAlloc( 100 );
    p->pActivity      = ABC_CALLOC( float, Gia_ManObjNum(pAig) );
    p->vActiveVars    = Vec_IntAlloc( 100 );
    return p;
}